

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O1

void lj_meta_istype(lua_State *L,BCReg ra,BCReg tp)

{
  uint uVar1;
  TValue *pTVar2;
  GCstr *pGVar3;
  long lVar4;
  int narg;
  
  L->top = L->base + *(byte *)((ulong)*(uint *)((ulong)L->base[-1].u32.lo + 0x10) - 0x39);
  narg = ra + 1;
  if (tp != 5) {
    if (tp != 0xf) {
      lj_err_argtype(L,narg,lj_obj_itypename[tp - 1]);
    }
    lj_lib_checknum(L,narg);
    return;
  }
  pTVar2 = L->base;
  lVar4 = (long)narg;
  if (L->top <= pTVar2 + lVar4 + -1) {
LAB_0011651d:
    lj_err_argt(L,narg,4);
  }
  uVar1 = *(uint *)((long)pTVar2 + lVar4 * 8 + -4);
  if (uVar1 != 0xfffffffb) {
    if (0xfffeffff < uVar1) goto LAB_0011651d;
    pGVar3 = lj_strfmt_number(L,pTVar2 + lVar4 + -1);
    pTVar2[lVar4 + -1].u32.lo = (uint32_t)pGVar3;
    *(undefined4 *)((long)pTVar2 + lVar4 * 8 + -4) = 0xfffffffb;
  }
  return;
}

Assistant:

void lj_meta_istype(lua_State *L, BCReg ra, BCReg tp)
{
  L->top = curr_topL(L);
  ra++; tp--;
  lj_assertL(LJ_DUALNUM || tp != ~LJ_TNUMX, "bad type for ISTYPE");
  if (LJ_DUALNUM && tp == ~LJ_TNUMX) lj_lib_checkint(L, ra);
  else if (tp == ~LJ_TNUMX+1) lj_lib_checknum(L, ra);
  else if (tp == ~LJ_TSTR) lj_lib_checkstr(L, ra);
  else lj_err_argtype(L, ra, lj_obj_itypename[tp]);
}